

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

void RigidBodyDynamics::CalcConstraintsJacobian
               (Model *model,VectorNd *Q,ConstraintSet *CS,MatrixNd *G,bool update_kinematics)

{
  long *plVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  undefined7 in_register_00000081;
  
  uVar6 = (uint)CONCAT71(in_register_00000081,update_kinematics);
  if (uVar6 != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  lVar3 = *(long *)(CS + 200);
  if (*(long *)(CS + 0xd0) != lVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      plVar1 = *(long **)(lVar3 + uVar4 * 0x10);
      (**(code **)(*plVar1 + 8))(0,plVar1,model,Q,CS + 0x620,G,CS + 0x620,uVar6 & 0xff);
      lVar3 = *(long *)(CS + 200);
      bVar2 = uVar5 < (ulong)(*(long *)(CS + 0xd0) - lVar3 >> 4);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcConstraintsJacobian (
  Model &model,
  const Math::VectorNd &Q,
  ConstraintSet &CS,
  Math::MatrixNd &G,
  bool update_kinematics
)
{
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  for(unsigned int i=0; i<CS.constraints.size(); ++i) {
    CS.constraints[i]->calcConstraintJacobian(model,0,Q,CS.cache.vecNZeros,G,
        CS.cache,update_kinematics);
  }
}